

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-factory.cpp
# Opt level: O2

void __thiscall
dynamicgraph::ExceptionFactory::ExceptionFactory
          (ExceptionFactory *this,ErrorCodeEnum *errcode,string *msg,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buffer [256];
  undefined8 local_1e8;
  void **local_1e0;
  undefined1 *local_1d8;
  undefined1 local_1c8 [32];
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  ErrorCodeEnum local_118 [64];
  
  if (in_AL != '\0') {
    local_198 = in_XMM0_Qa;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  local_118[0] = *errcode;
  local_1a8 = in_R8;
  local_1a0 = in_R9;
  ExceptionAbstract::ExceptionAbstract(&this->super_ExceptionAbstract,(int *)local_118,msg);
  *(undefined ***)&this->super_ExceptionAbstract = &PTR__ExceptionAbstract_00137a10;
  local_1e0 = &args[0].overflow_arg_area;
  local_1e8 = 0x3000000020;
  local_1d8 = local_1c8;
  vsnprintf((char *)local_118,0x100,format,&local_1e8);
  std::__cxx11::string::append((char *)&(this->super_ExceptionAbstract).message);
  return;
}

Assistant:

ExceptionFactory::ExceptionFactory(
    const ExceptionFactory::ErrorCodeEnum &errcode, const std::string &msg,
    const char *format, ...)
    : ExceptionAbstract(errcode, msg) {
  va_list args;
  va_start(args, format);

  const unsigned int SIZE = 256;
  char buffer[SIZE];
  vsnprintf(buffer, SIZE, format, args);

  dgDEBUG(15) << "Created "
              << " with message <" << msg << "> and buffer <" << buffer << ">. "
              << std::endl;

  message += buffer;

  va_end(args);

  dgDEBUG(1) << "Throw exception " << EXCEPTION_NAME << "[#" << errcode << "]: "
             << "<" << message << ">." << std::endl;
}